

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O0

document_iterator __thiscall llvm::yaml::document_iterator::operator++(document_iterator *this)

{
  Stream *S_00;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *this_00;
  bool bVar1;
  pointer pDVar2;
  Document *this_01;
  Stream *S;
  document_iterator *this_local;
  
  if (this->Doc ==
      (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0) {
    __assert_fail("Doc && \"incrementing iterator past the end.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLParser.h"
                  ,0x253,"document_iterator llvm::yaml::document_iterator::operator++()");
  }
  pDVar2 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
           operator->(this->Doc);
  bVar1 = Document::skip(pDVar2);
  if (bVar1) {
    pDVar2 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
             operator->(this->Doc);
    S_00 = pDVar2->stream;
    this_00 = this->Doc;
    this_01 = (Document *)operator_new(0xa8);
    Document::Document(this_01,S_00);
    std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::reset
              (this_00,this_01);
  }
  else {
    std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::reset
              (this->Doc,(pointer)0x0);
  }
  return (document_iterator)this->Doc;
}

Assistant:

document_iterator operator++() {
    assert(Doc && "incrementing iterator past the end.");
    if (!(*Doc)->skip()) {
      Doc->reset(nullptr);
    } else {
      Stream &S = (*Doc)->stream;
      Doc->reset(new Document(S));
    }
    return *this;
  }